

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_actor.hpp
# Opt level: O1

property_type * __thiscall
cpp_properties::
properties_actor<cpp_properties::properties_actor_traits<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_back_adapter_policy>_>
::allocate(properties_actor<cpp_properties::properties_actor_traits<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_back_adapter_policy>_>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  this->current_reference = (current_reference_callback)get;
  *(undefined8 *)&this->field_0x58 = 0;
  paVar1 = &local_68.first.field_2;
  local_68.first._M_string_length = 0;
  local_68.first.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_68.second.field_2;
  local_68.second._M_string_length = 0;
  local_68.second.field_2._M_local_buf[0] = '\0';
  local_68.first._M_dataplus._M_p = (pointer)paVar1;
  local_68.second._M_dataplus._M_p = (pointer)paVar2;
  boost::optional_detail::
  optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::assign(&(this->property).super_type,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.second._M_dataplus._M_p,
                    CONCAT71(local_68.second.field_2._M_allocated_capacity._1_7_,
                             local_68.second.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first._M_dataplus._M_p,
                    CONCAT71(local_68.first.field_2._M_allocated_capacity._1_7_,
                             local_68.first.field_2._M_local_buf[0]) + 1);
  }
  if ((this->property).super_type.m_initialized != false) {
    return (property_type *)&(this->property).super_type.m_storage;
  }
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                "reference_type boost::optional<std::pair<std::basic_string<char>, std::basic_string<char>>>::get() [T = std::pair<std::basic_string<char>, std::basic_string<char>>]"
               );
}

Assistant:

property_type &allocate() {
    current_reference = &properties_actor::get;
    property = property_type();
    return *property;
  }